

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Optional<Catch::ReporterSpec> * Catch::parseReporterSpec(StringRef reporterSpec)

{
  StringRef other;
  StringRef other_00;
  StringRef kvString;
  bool bVar1;
  char cVar2;
  Optional<Catch::ReporterSpec> *pOVar3;
  size_type sVar4;
  reference pvVar5;
  Optional<Catch::ReporterSpec> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  ret;
  StringRef value;
  StringRef key;
  kvPair kv;
  size_t i;
  Optional<Catch::ColourMode> colourMode;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outputFileName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  kvPairs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce5;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffce8;
  Optional<Catch::ReporterSpec> *this;
  char *in_stack_fffffffffffffd08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd10;
  _Base_ptr in_stack_fffffffffffffd18;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd20;
  _Base_ptr in_stack_fffffffffffffd28;
  ReporterSpec *in_stack_fffffffffffffd30;
  StringRef in_stack_fffffffffffffd40;
  StringRef in_stack_fffffffffffffd60;
  string local_290 [168];
  char *local_1e8;
  size_type sStack_1e0;
  string local_1b0 [48];
  _Base_ptr local_180;
  undefined1 local_178;
  string local_170 [32];
  string local_150 [32];
  _Base_ptr local_130;
  byte local_128;
  undefined4 local_11c;
  StringRef local_118;
  StringRef local_108 [2];
  char *local_e8;
  size_type local_e0;
  char *local_d8;
  size_type local_d0;
  Optional<Catch::ReporterSpec> *local_c8;
  Optional<Catch::ColourMode> local_c0 [2];
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [2];
  
  Detail::splitReporterSpec_abi_cxx11_(in_stack_fffffffffffffd60);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x177e56);
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Optional(local_a0);
  Optional<Catch::ColourMode>::Optional(local_c0);
  local_c8 = (Optional<Catch::ReporterSpec> *)0x1;
  do {
    this = local_c8;
    pOVar3 = (Optional<Catch::ReporterSpec> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(local_30);
    if (pOVar3 <= this) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_30,0);
      std::__cxx11::string::string(local_290,(string *)pvVar5);
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,(Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffce8._M_node);
      Optional<Catch::ColourMode>::Optional
                ((Optional<Catch::ColourMode> *)this,
                 (Optional<Catch::ColourMode> *)in_stack_fffffffffffffce8._M_node);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffce7,
                        CONCAT16(in_stack_fffffffffffffce6,
                                 CONCAT15(in_stack_fffffffffffffce5,
                                          CONCAT14(in_stack_fffffffffffffce4,
                                                   in_stack_fffffffffffffce0)))),
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xfffffffffffffd08);
      ReporterSpec::ReporterSpec
                (in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffd20,(Optional<Catch::ColourMode> *)in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd10);
      Optional<Catch::ReporterSpec>::Optional
                (this,(ReporterSpec *)in_stack_fffffffffffffce8._M_node);
      ReporterSpec::~ReporterSpec
                ((ReporterSpec *)
                 CONCAT17(in_stack_fffffffffffffce7,
                          CONCAT16(in_stack_fffffffffffffce6,
                                   CONCAT15(in_stack_fffffffffffffce5,
                                            CONCAT14(in_stack_fffffffffffffce4,
                                                     in_stack_fffffffffffffce0)))));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x17840c);
      Optional<Catch::ColourMode>::~Optional((Optional<Catch::ColourMode> *)0x178416);
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x178420);
      std::__cxx11::string::~string(local_290);
LAB_001784cd:
      local_11c = 1;
      Optional<Catch::ColourMode>::~Optional((Optional<Catch::ColourMode> *)0x1784da);
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1784e7);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1784f4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
      return in_RDI;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_30,(size_type)local_c8);
    StringRef::StringRef
              ((StringRef *)
               CONCAT17(in_stack_fffffffffffffce7,
                        CONCAT16(in_stack_fffffffffffffce6,
                                 CONCAT15(in_stack_fffffffffffffce5,
                                          CONCAT14(in_stack_fffffffffffffce4,
                                                   in_stack_fffffffffffffce0)))),
               in_stack_fffffffffffffcd8);
    kvString.m_size = (size_type)in_stack_fffffffffffffd10;
    kvString.m_start = in_stack_fffffffffffffd08;
    anon_unknown_26::splitKVPair(kvString);
    local_108[0].m_start = local_e8;
    local_108[0].m_size = local_e0;
    local_118.m_start = local_d8;
    local_118.m_size = local_d0;
    bVar1 = StringRef::empty(local_108);
    if ((bVar1) || (bVar1 = StringRef::empty(&local_118), bVar1)) {
      Optional<Catch::ReporterSpec>::Optional(in_RDI);
      goto LAB_001784cd;
    }
    cVar2 = StringRef::operator[](local_108,0);
    if (cVar2 == 'X') {
      sVar4 = StringRef::size(local_108);
      if (sVar4 == 1) {
        Optional<Catch::ReporterSpec>::Optional(in_RDI);
        goto LAB_001784cd;
      }
      StringRef::operator_cast_to_string((StringRef *)in_stack_fffffffffffffd18);
      StringRef::operator_cast_to_string((StringRef *)in_stack_fffffffffffffd18);
      pVar6 = std::
              map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::emplace<std::__cxx11::string,std::__cxx11::string>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffce8._M_node,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffce7,
                                  CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT15(in_stack_fffffffffffffce5,
                                                    CONCAT14(in_stack_fffffffffffffce4,
                                                             in_stack_fffffffffffffce0)))));
      in_stack_fffffffffffffce8 = pVar6.first._M_node;
      in_stack_fffffffffffffce7 = pVar6.second;
      local_180 = in_stack_fffffffffffffce8._M_node;
      local_178 = in_stack_fffffffffffffce7;
      local_130 = in_stack_fffffffffffffce8._M_node;
      local_128 = in_stack_fffffffffffffce7;
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_150);
      if ((local_128 & 1) == 0) {
        Optional<Catch::ReporterSpec>::Optional(in_RDI);
        goto LAB_001784cd;
      }
    }
    else {
      StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffce8._M_node);
      other.m_size = (size_type)this;
      other.m_start = (char *)in_stack_fffffffffffffce8._M_node;
      bVar1 = StringRef::operator==
                        ((StringRef *)
                         CONCAT17(in_stack_fffffffffffffce7,
                                  CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT15(in_stack_fffffffffffffce5,
                                                    CONCAT14(in_stack_fffffffffffffce4,
                                                             in_stack_fffffffffffffce0)))),other);
      if (bVar1) {
        in_stack_fffffffffffffce6 =
             Optional::operator_cast_to_bool
                       ((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x178167);
        if ((bool)in_stack_fffffffffffffce6) {
          Optional<Catch::ReporterSpec>::Optional(in_RDI);
          goto LAB_001784cd;
        }
        StringRef::operator_cast_to_string((StringRef *)in_stack_fffffffffffffd18);
        Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffce8._M_node);
        std::__cxx11::string::~string(local_1b0);
      }
      else {
        StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffce8._M_node);
        other_00.m_size = (size_type)this;
        other_00.m_start = (char *)in_stack_fffffffffffffce8._M_node;
        bVar1 = StringRef::operator==
                          ((StringRef *)
                           CONCAT17(in_stack_fffffffffffffce7,
                                    CONCAT16(in_stack_fffffffffffffce6,
                                             CONCAT15(in_stack_fffffffffffffce5,
                                                      CONCAT14(in_stack_fffffffffffffce4,
                                                               in_stack_fffffffffffffce0)))),
                           other_00);
        if (!bVar1) {
          Optional<Catch::ReporterSpec>::Optional(in_RDI);
          goto LAB_001784cd;
        }
        in_stack_fffffffffffffce5 =
             Optional::operator_cast_to_bool((Optional<Catch::ColourMode> *)0x178240);
        if ((bool)in_stack_fffffffffffffce5) {
          Optional<Catch::ReporterSpec>::Optional(in_RDI);
          goto LAB_001784cd;
        }
        local_1e8 = local_118.m_start;
        sStack_1e0 = local_118.m_size;
        Detail::stringToColourMode(in_stack_fffffffffffffd40);
        Optional<Catch::ColourMode>::operator=
                  ((Optional<Catch::ColourMode> *)this,
                   (Optional<Catch::ColourMode> *)in_stack_fffffffffffffce8._M_node);
        Optional<Catch::ColourMode>::~Optional((Optional<Catch::ColourMode> *)0x1782bf);
        in_stack_fffffffffffffce4 = Optional<Catch::ColourMode>::operator!(local_c0);
        if ((bool)in_stack_fffffffffffffce4) {
          Optional<Catch::ReporterSpec>::Optional(in_RDI);
          goto LAB_001784cd;
        }
      }
    }
    local_c8 = (Optional<Catch::ReporterSpec> *)((long)&local_c8->nullableValue + 1);
  } while( true );
}

Assistant:

Optional<ReporterSpec> parseReporterSpec( StringRef reporterSpec ) {
        auto parts = Detail::splitReporterSpec( reporterSpec );

        assert( parts.size() > 0 && "Split should never return empty vector" );

        std::map<std::string, std::string> kvPairs;
        Optional<std::string> outputFileName;
        Optional<ColourMode> colourMode;

        // First part is always reporter name, so we skip it
        for ( size_t i = 1; i < parts.size(); ++i ) {
            auto kv = splitKVPair( parts[i] );
            auto key = kv.key, value = kv.value;

            if ( key.empty() || value.empty() ) { // NOLINT(bugprone-branch-clone)
                return {};
            } else if ( key[0] == 'X' ) {
                // This is a reporter-specific option, we don't check these
                // apart from basic sanity checks
                if ( key.size() == 1 ) {
                    return {};
                }

                auto ret = kvPairs.emplace( std::string(kv.key), std::string(kv.value) );
                if ( !ret.second ) {
                    // Duplicated key. We might want to handle this differently,
                    // e.g. by overwriting the existing value?
                    return {};
                }
            } else if ( key == "out" ) {
                // Duplicated key
                if ( outputFileName ) {
                    return {};
                }
                outputFileName = static_cast<std::string>( value );
            } else if ( key == "colour-mode" ) {
                // Duplicated key
                if ( colourMode ) {
                    return {};
                }
                colourMode = Detail::stringToColourMode( value );
                // Parsing failed
                if ( !colourMode ) {
                    return {};
                }
            } else {
                // Unrecognized option
                return {};
            }
        }

        return ReporterSpec{ CATCH_MOVE( parts[0] ),
                             CATCH_MOVE( outputFileName ),
                             CATCH_MOVE( colourMode ),
                             CATCH_MOVE( kvPairs ) };
    }